

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

bool __thiscall QCommandLineParserPrivate::parse(QCommandLineParserPrivate *this,QStringList *args)

{
  QLatin1StringView s;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  const_iterator o;
  qsizetype qVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  QCommandLineOption *arg;
  bool withValue;
  int pos;
  bool valueFound;
  bool forcePositional;
  bool error;
  QString optionName_2;
  const_iterator shortOptionIt;
  QString possibleShortOptionStyleName;
  mapped_type optionOffset;
  const_iterator nameHashIt;
  QString optionName_1;
  QString optionName;
  QString argument;
  const_iterator argumentIterator;
  QLatin1Char assignChar;
  QLatin1Char dashChar;
  undefined4 in_stack_fffffffffffffd88;
  Flag in_stack_fffffffffffffd8c;
  char16_t **in_stack_fffffffffffffd90;
  QCommandLineParserPrivate *in_stack_fffffffffffffd98;
  QString *in_stack_fffffffffffffda0;
  long in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  QList<QString> *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  const_iterator in_stack_fffffffffffffde8;
  const_iterator in_stack_fffffffffffffdf0;
  int local_1f4;
  Flag local_1ec;
  byte local_1c1;
  bool local_1a9;
  QFlagsStorageHelper<QCommandLineOption::Flag,_4> local_154;
  piter local_150;
  piter local_140;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  char local_115;
  char16_t local_112;
  const_iterator in_stack_fffffffffffffef8;
  QString local_50;
  const_iterator local_38 [5];
  QLatin1Char local_a;
  QLatin1Char local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)((long)&in_RDI[8].d.d + 2) = 0;
  local_1c1 = 0;
  local_9.ch = -0x56;
  QLatin1Char::QLatin1Char(&local_9,'-');
  local_a.ch = -0x56;
  QLatin1Char::QLatin1Char(&local_a,'=');
  bVar1 = false;
  QString::clear((QString *)in_stack_fffffffffffffd90);
  QList<QString>::clear((QList<QString> *)in_stack_fffffffffffffd90);
  QList<QString>::clear((QList<QString> *)in_stack_fffffffffffffd90);
  QList<QString>::clear((QList<QString> *)in_stack_fffffffffffffd90);
  QHash<long_long,_QList<QString>_>::clear
            ((QHash<long_long,_QList<QString>_> *)in_stack_fffffffffffffd90);
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x175e6d);
  if (bVar2) {
    local_1a9 = false;
  }
  else {
    local_38[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_38[0] = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffd90);
    QList<QString>::const_iterator::operator++(local_38);
    while( true ) {
      o = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffd90);
      bVar2 = QList<QString>::const_iterator::operator!=(local_38,o);
      if (!bVar2) break;
      local_50.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_50.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_50.d.size = -0x5555555555555556;
      QList<QString>::const_iterator::operator*(local_38);
      QString::QString((QString *)in_stack_fffffffffffffd90,
                       (QString *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      if (bVar1) {
        QList<QString>::append
                  ((QList<QString> *)in_stack_fffffffffffffd90,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
LAB_00176925:
        in_stack_fffffffffffffde8 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffd90)
        ;
        bVar2 = QList<QString>::const_iterator::operator==(local_38,in_stack_fffffffffffffde8);
        if (bVar2) {
          local_1ec = IgnoreOptionsAfter;
        }
        else {
          local_1ec = 0;
        }
      }
      else {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90);
        s.m_data._7_1_ = in_stack_fffffffffffffdb7;
        s.m_data._0_7_ = in_stack_fffffffffffffdb0;
        s.m_size = (qsizetype)in_stack_fffffffffffffdb8;
        bVar2 = QString::startsWith((QString *)
                                    CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),s,
                                    CaseInsensitive);
        if (bVar2) {
          qVar4 = QString::size(&local_50);
          if (qVar4 < 3) {
            bVar1 = true;
          }
          else {
            QString::mid((QString *)in_stack_fffffffffffffdb8,
                         CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                         in_stack_fffffffffffffda8);
            QChar::QChar<QLatin1Char,_true>
                      ((QChar *)in_stack_fffffffffffffd90,
                       (QLatin1Char)(char)((ulong)in_stack_fffffffffffffd98 >> 0x38));
            QFlags<QString::SectionFlag>::QFlags
                      ((QFlags<QString::SectionFlag> *)in_stack_fffffffffffffd90,
                       in_stack_fffffffffffffd8c);
            QString::section((QString *)in_stack_fffffffffffffdb8,
                             (QChar)(char16_t)((ulong)in_stack_fffffffffffffde8.i >> 0x30),
                             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                             in_stack_fffffffffffffda8,
                             (QFlagsStorageHelper<QString::SectionFlag,_4>)
                             SUB84(in_stack_fffffffffffffde8.i,0));
            QString::~QString((QString *)0x1760a2);
            bVar2 = registerFoundOption(in_stack_fffffffffffffd98,
                                        (QString *)in_stack_fffffffffffffd90);
            if (bVar2) {
              QList<QString>::end((QList<QString> *)in_stack_fffffffffffffd90);
              bVar2 = parseOptionValue((QCommandLineParserPrivate *)in_stack_fffffffffffffdf0.i,
                                       in_stack_fffffffffffffde8.i,in_RDI,
                                       (const_iterator *)
                                       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                       ,in_stack_fffffffffffffef8);
              if (!bVar2) {
                local_1c1 = 1;
              }
            }
            else {
              local_1c1 = 1;
            }
            QString::~QString((QString *)0x17611c);
          }
          goto LAB_00176925;
        }
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)in_stack_fffffffffffffd90,
                   (QLatin1Char)(char)((ulong)in_stack_fffffffffffffd98 >> 0x38));
        bVar2 = QString::startsWith(&in_stack_fffffffffffffd98->errorText,
                                    (QChar)(char16_t)((ulong)in_stack_fffffffffffffda8 >> 0x30),
                                    (CaseSensitivity)((ulong)in_stack_fffffffffffffd90 >> 0x20));
        if (!bVar2) {
          QList<QString>::append
                    ((QList<QString> *)in_stack_fffffffffffffd90,
                     (parameter_type)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
          if (*(int *)((long)&in_RDI[7].d.size + 4) == 1) {
            bVar1 = true;
          }
          goto LAB_00176925;
        }
        qVar4 = QString::size(&local_50);
        if (qVar4 != 1) {
          in_stack_fffffffffffffddc = (int)in_RDI[7].d.size;
          if (in_stack_fffffffffffffddc == 0) {
            QString::QString((QString *)0x17620b);
            bVar2 = false;
            for (local_1f4 = 1; qVar4 = QString::size(&local_50), local_1f4 < qVar4;
                local_1f4 = local_1f4 + 1) {
              QString::mid((QString *)in_stack_fffffffffffffdb8,
                           CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                           in_stack_fffffffffffffda8);
              QString::operator=((QString *)in_stack_fffffffffffffd90,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
              QString::~QString((QString *)0x17628d);
              bVar3 = registerFoundOption(in_stack_fffffffffffffd98,
                                          (QString *)in_stack_fffffffffffffd90);
              if (bVar3) {
                QHash<QString,_long_long>::constFind
                          ((QHash<QString,_long_long> *)in_stack_fffffffffffffd90,
                           (QString *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88))
                ;
                QHash<QString,_long_long>::const_iterator::operator*((const_iterator *)0x176301);
                QList<QCommandLineOption>::at
                          ((QList<QCommandLineOption> *)in_stack_fffffffffffffd90,
                           CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
                QCommandLineOption::valueName((QCommandLineOption *)in_stack_fffffffffffffd98);
                bVar3 = QString::isEmpty((QString *)0x17633f);
                QString::~QString((QString *)0x176352);
                if (((bVar3 ^ 0xffU) & 1) != 0) {
                  qVar4 = QString::size(&local_50);
                  if (local_1f4 + 1 < qVar4) {
                    QString::at(&in_stack_fffffffffffffd98->errorText,
                                (qsizetype)in_stack_fffffffffffffd90);
                    QChar::QChar<QLatin1Char,_true>
                              ((QChar *)in_stack_fffffffffffffd90,
                               (QLatin1Char)(char)((ulong)in_stack_fffffffffffffd98 >> 0x38));
                    ::operator==((QChar *)in_stack_fffffffffffffd90,
                                 (QChar *)CONCAT44(in_stack_fffffffffffffd8c,
                                                   in_stack_fffffffffffffd88));
                    in_stack_fffffffffffffdb8 =
                         QHash<long_long,_QList<QString>_>::operator[]
                                   ((QHash<long_long,_QList<QString>_> *)in_stack_fffffffffffffda0,
                                    (longlong *)in_stack_fffffffffffffd98);
                    QString::mid((QString *)in_stack_fffffffffffffdb8,
                                 CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                                 in_stack_fffffffffffffda8);
                    QList<QString>::append
                              ((QList<QString> *)in_stack_fffffffffffffd90,
                               (rvalue_ref)
                               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
                    QString::~QString((QString *)0x176470);
                    bVar2 = true;
                  }
                  break;
                }
                in_stack_fffffffffffffda8 = (long)(local_1f4 + 1);
                qVar4 = QString::size(&local_50);
                in_stack_fffffffffffffdb7 = false;
                if (in_stack_fffffffffffffda8 < qVar4) {
                  local_112 = (char16_t)
                              QString::at(&in_stack_fffffffffffffd98->errorText,
                                          (qsizetype)in_stack_fffffffffffffd90);
                  local_115 = local_a.ch;
                  QChar::QChar<QLatin1Char,_true>
                            ((QChar *)in_stack_fffffffffffffd90,
                             (QLatin1Char)(char)((ulong)in_stack_fffffffffffffd98 >> 0x38));
                  in_stack_fffffffffffffdb7 =
                       ::operator==((QChar *)in_stack_fffffffffffffd90,
                                    (QChar *)CONCAT44(in_stack_fffffffffffffd8c,
                                                      in_stack_fffffffffffffd88));
                }
                if ((bool)in_stack_fffffffffffffdb7 != false) break;
              }
              else {
                local_1c1 = 1;
              }
            }
            if (!bVar2) {
              QList<QString>::end((QList<QString> *)in_stack_fffffffffffffd90);
              bVar2 = parseOptionValue((QCommandLineParserPrivate *)in_stack_fffffffffffffdf0.i,
                                       in_stack_fffffffffffffde8.i,in_RDI,
                                       (const_iterator *)
                                       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                       ,in_stack_fffffffffffffef8);
              if (!bVar2) {
                local_1c1 = 1;
              }
            }
            QString::~QString((QString *)0x176599);
          }
          else if (in_stack_fffffffffffffddc == 1) {
            qVar4 = QString::size(&local_50);
            if (2 < qVar4) {
              local_130 = 0xaaaaaaaaaaaaaaaa;
              local_128 = 0xaaaaaaaaaaaaaaaa;
              local_120 = 0xaaaaaaaaaaaaaaaa;
              QString::mid((QString *)in_stack_fffffffffffffdb8,
                           CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                           in_stack_fffffffffffffda8);
              local_140.bucket = 0xaaaaaaaaaaaaaaaa;
              local_140.d = (Data<QHashPrivate::Node<QString,_long_long>_> *)0xaaaaaaaaaaaaaaaa;
              local_140 = (piter)QHash<QString,_long_long>::constFind
                                           ((QHash<QString,_long_long> *)in_stack_fffffffffffffd90,
                                            (QString *)
                                            CONCAT44(in_stack_fffffffffffffd8c,
                                                     in_stack_fffffffffffffd88));
              local_150 = (piter)QHash<QString,_long_long>::constEnd
                                           ((QHash<QString,_long_long> *)in_stack_fffffffffffffd98);
              bVar2 = QHash<QString,_long_long>::const_iterator::operator!=
                                ((const_iterator *)in_stack_fffffffffffffd98,
                                 (const_iterator *)in_stack_fffffffffffffd90);
              if (bVar2) {
                in_stack_fffffffffffffda0 = in_RDI + 1;
                QHash<QString,_long_long>::const_iterator::operator*((const_iterator *)0x1766a9);
                QList<QCommandLineOption>::at
                          ((QList<QCommandLineOption> *)in_stack_fffffffffffffd90,
                           CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
                QCommandLineOption::flags((QCommandLineOption *)in_stack_fffffffffffffd90);
                local_154.super_QFlagsStorage<QCommandLineOption::Flag>.i =
                     (QFlagsStorage<QCommandLineOption::Flag>)
                     QFlags<QCommandLineOption::Flag>::operator&
                               ((QFlags<QCommandLineOption::Flag> *)in_stack_fffffffffffffd90,
                                in_stack_fffffffffffffd8c);
                bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_154);
                if (!bVar2) goto LAB_00176789;
                registerFoundOption(in_stack_fffffffffffffd98,(QString *)in_stack_fffffffffffffd90);
                in_stack_fffffffffffffd90 = &in_RDI[2].d.ptr;
                QHash<QString,_long_long>::const_iterator::operator*((const_iterator *)0x176728);
                in_stack_fffffffffffffd98 =
                     (QCommandLineParserPrivate *)
                     QHash<long_long,_QList<QString>_>::operator[]
                               ((QHash<long_long,_QList<QString>_> *)in_stack_fffffffffffffda0,
                                (longlong *)in_stack_fffffffffffffd98);
                QString::mid((QString *)in_stack_fffffffffffffdb8,
                             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                             in_stack_fffffffffffffda8);
                QList<QString>::append
                          ((QList<QString> *)in_stack_fffffffffffffd90,
                           (rvalue_ref)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)
                          );
                QString::~QString((QString *)0x17677a);
                local_1ec = 7;
              }
              else {
LAB_00176789:
                local_1ec = 0;
              }
              QString::~QString((QString *)0x1767a1);
              if (local_1ec != 0) goto LAB_00176925;
            }
            QString::mid((QString *)in_stack_fffffffffffffdb8,
                         CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                         in_stack_fffffffffffffda8);
            QChar::QChar<QLatin1Char,_true>
                      ((QChar *)in_stack_fffffffffffffd90,
                       (QLatin1Char)(char)((ulong)in_stack_fffffffffffffd98 >> 0x38));
            QFlags<QString::SectionFlag>::QFlags
                      ((QFlags<QString::SectionFlag> *)in_stack_fffffffffffffd90,
                       in_stack_fffffffffffffd8c);
            QString::section((QString *)in_stack_fffffffffffffdb8,
                             (QChar)(char16_t)((ulong)in_stack_fffffffffffffde8.i >> 0x30),
                             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                             in_stack_fffffffffffffda8,
                             (QFlagsStorageHelper<QString::SectionFlag,_4>)
                             SUB84(in_stack_fffffffffffffde8.i,0));
            QString::~QString((QString *)0x176872);
            bVar2 = registerFoundOption(in_stack_fffffffffffffd98,
                                        (QString *)in_stack_fffffffffffffd90);
            if (bVar2) {
              in_stack_fffffffffffffdf0 =
                   QList<QString>::end((QList<QString> *)in_stack_fffffffffffffd90);
              bVar2 = parseOptionValue((QCommandLineParserPrivate *)in_stack_fffffffffffffdf0.i,
                                       in_stack_fffffffffffffde8.i,in_RDI,
                                       (const_iterator *)
                                       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                       ,in_stack_fffffffffffffef8);
              if (!bVar2) {
                local_1c1 = 1;
              }
            }
            else {
              local_1c1 = 1;
            }
            QString::~QString((QString *)0x1768f1);
          }
          goto LAB_00176925;
        }
        QList<QString>::append
                  ((QList<QString> *)in_stack_fffffffffffffd90,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
        local_1ec = IgnoreOptionsAfter|ShortOptionStyle;
      }
      QString::~QString((QString *)0x176974);
      if ((local_1ec != 0) && (local_1ec == IgnoreOptionsAfter)) break;
      QList<QString>::const_iterator::operator++(local_38);
      in_stack_fffffffffffffd8c = local_1ec;
    }
    local_1a9 = (bool)((local_1c1 ^ 0xff) & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1a9;
}

Assistant:

bool QCommandLineParserPrivate::parse(const QStringList &args)
{
    needsParsing = false;
    bool error = false;

    const QLatin1Char dashChar('-');
    const QLatin1Char assignChar('=');

    bool forcePositional = false;
    errorText.clear();
    positionalArgumentList.clear();
    optionNames.clear();
    unknownOptionNames.clear();
    optionValuesHash.clear();

    if (args.isEmpty()) {
        qWarning("QCommandLineParser: argument list cannot be empty, it should contain at least the executable name");
        return false;
    }

    QStringList::const_iterator argumentIterator = args.begin();
    ++argumentIterator; // skip executable name

    for (; argumentIterator != args.end() ; ++argumentIterator) {
        QString argument = *argumentIterator;

        if (forcePositional) {
            positionalArgumentList.append(argument);
        } else if (argument.startsWith("--"_L1)) {
            if (argument.size() > 2) {
                QString optionName = argument.mid(2).section(assignChar, 0, 0);
                if (registerFoundOption(optionName)) {
                    if (!parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                        error = true;
                } else {
                    error = true;
                }
            } else {
                forcePositional = true;
            }
        } else if (argument.startsWith(dashChar)) {
            if (argument.size() == 1) { // single dash ("stdin")
                positionalArgumentList.append(argument);
                continue;
            }
            switch (singleDashWordOptionMode) {
            case QCommandLineParser::ParseAsCompactedShortOptions:
            {
                QString optionName;
                bool valueFound = false;
                for (int pos = 1 ; pos < argument.size(); ++pos) {
                    optionName = argument.mid(pos, 1);
                    if (!registerFoundOption(optionName)) {
                        error = true;
                    } else {
                        const NameHash_t::const_iterator nameHashIt = nameHash.constFind(optionName);
                        Q_ASSERT(nameHashIt != nameHash.constEnd()); // checked by registerFoundOption
                        const NameHash_t::mapped_type optionOffset = *nameHashIt;
                        const bool withValue = !commandLineOptionList.at(optionOffset).valueName().isEmpty();
                        if (withValue) {
                            if (pos + 1 < argument.size()) {
                                if (argument.at(pos + 1) == assignChar)
                                    ++pos;
                                optionValuesHash[optionOffset].append(argument.mid(pos + 1));
                                valueFound = true;
                            }
                            break;
                        }
                        if (pos + 1 < argument.size() && argument.at(pos + 1) == assignChar)
                            break;
                    }
                }
                if (!valueFound && !parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                    error = true;
                break;
            }
            case QCommandLineParser::ParseAsLongOptions:
            {
                if (argument.size() > 2) {
                    const QString possibleShortOptionStyleName = argument.mid(1, 1);
                    const auto shortOptionIt = nameHash.constFind(possibleShortOptionStyleName);
                    if (shortOptionIt != nameHash.constEnd()) {
                        const auto &arg = commandLineOptionList.at(*shortOptionIt);
                        if (arg.flags() & QCommandLineOption::ShortOptionStyle) {
                            registerFoundOption(possibleShortOptionStyleName);
                            optionValuesHash[*shortOptionIt].append(argument.mid(2));
                            break;
                        }
                    }
                }
                const QString optionName = argument.mid(1).section(assignChar, 0, 0);
                if (registerFoundOption(optionName)) {
                    if (!parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                        error = true;
                } else {
                    error = true;
                }
                break;
            }
            }
        } else {
            positionalArgumentList.append(argument);
            if (optionsAfterPositionalArgumentsMode == QCommandLineParser::ParseAsPositionalArguments)
                forcePositional = true;
        }
        if (argumentIterator == args.end())
            break;
    }
    return !error;
}